

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_oct
          (int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  format_specs *pfVar4;
  ulong uVar5;
  ulong uVar6;
  bin_writer<3> f;
  undefined1 auVar7 [16];
  int num_digits;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  string_view prefix;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  uVar2 = (ulong)this->abs_value;
  uVar3 = *(ulong *)((long)&this->abs_value + 8);
  auVar7 = (undefined1  [16])this->abs_value;
  num_digits = 0;
  uVar8 = uVar3;
  uVar9 = uVar2;
  do {
    uVar5 = uVar8 << 0x3d;
    num_digits = num_digits + 1;
    bVar10 = 7 < uVar9;
    bVar11 = uVar8 != 0;
    uVar6 = -uVar8;
    uVar8 = uVar8 >> 3;
    uVar9 = uVar5 | uVar9 >> 3;
  } while (bVar11 || uVar6 < bVar10);
  pfVar4 = this->specs;
  if (((char)pfVar4->field_0x9 < '\0') &&
     ((uVar2 != 0 || uVar3 != 0) && pfVar4->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  prefix.data_ = this->prefix;
  f._20_4_ = uStack_14;
  f.num_digits = num_digits;
  f.abs_value = (unsigned_type)auVar7;
  f._24_8_ = uStack_10;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,num_digits,prefix,*pfVar4,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }